

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O0

void __thiscall iDynTree::MatrixDynSize::MatrixDynSize(MatrixDynSize *this,MatrixDynSize *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__MatrixDynSize_00852c28;
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  in_RDI[3] = *(undefined8 *)(in_RSI + 0x18);
  in_RDI[4] = *(long *)(in_RSI + 0x10) * *(long *)(in_RSI + 0x18);
  if (in_RDI[4] == 0) {
    in_RDI[1] = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI[4];
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    in_RDI[1] = pvVar3;
    memcpy((void *)in_RDI[1],*(void **)(in_RSI + 8),in_RDI[4] << 3);
  }
  return;
}

Assistant:

MatrixDynSize::MatrixDynSize(const MatrixDynSize& other)
: m_rows(other.m_rows)
, m_cols(other.m_cols)
, m_capacity(other.m_rows * other.m_cols)
{
    if (this->m_capacity == 0)
    {
        this->m_data = 0;
        return;
    }

    this->m_data = new double[this->m_capacity];
    std::memcpy(this->m_data, other.m_data, m_capacity * sizeof(double));
}